

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

void sense_trap(trap *trap,xchar x,xchar y,int src_cursed)

{
  boolean bVar1;
  long lVar2;
  obj *poVar3;
  trap *ptVar4;
  byte bVar5;
  trap temp_trap;
  
  bVar5 = 0;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
    if (src_cursed == 0) goto LAB_0015f98a;
  }
  else if (((u.umonnum != u.umonster) && (bVar1 = dmgtype(youmonst.data,0x24), src_cursed == 0)) &&
          (bVar1 != '\0')) {
LAB_0015f98a:
    if (trap != (trap *)0x0) {
      map_trap(trap,1);
      trap->field_0x8 = trap->field_0x8 | 0x20;
      return;
    }
    temp_trap._8_1_ = 5;
    temp_trap.tx = x;
    temp_trap.ty = y;
    map_trap(&temp_trap,1);
    return;
  }
  poVar3 = &zeroobj;
  ptVar4 = &temp_trap;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(obj **)ptVar4 = poVar3->nobj;
    poVar3 = (obj *)((long)poVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    ptVar4 = (trap *)((long)ptVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  if (src_cursed == 0) {
    display_rng(0x219);
  }
  display_rng(0x193);
  map_object((obj *)&temp_trap,1);
  return;
}

Assistant:

static void sense_trap(struct trap *trap, xchar x, xchar y, int src_cursed)
{
    if (Hallucination || src_cursed) {
	struct obj obj;			/* fake object */
	obj = zeroobj;
	if (trap) {
	    obj.ox = trap->tx;
	    obj.oy = trap->ty;
	} else {
	    obj.ox = x;
	    obj.oy = y;
	}
	obj.otyp = (src_cursed) ? GOLD_PIECE : random_object();
	obj.corpsenm = random_monster();	/* if otyp == CORPSE */
	map_object(&obj,1);
    } else if (trap) {
	map_trap(trap,1);
	trap->tseen = 1;
    } else {
	struct trap temp_trap;		/* fake trap */
	temp_trap.tx = x;
	temp_trap.ty = y;
	temp_trap.ttyp = BEAR_TRAP;	/* some kind of trap */
	map_trap(&temp_trap, 1);
    }

}